

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

bool __thiscall
cfd::core::KeyFormatData::IsFindFormatType(KeyFormatData *this,Bip32FormatType format_type)

{
  if (format_type < (kBip84|kBip49)) {
    return (*(this->has_format_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p >>
            ((ulong)format_type & 0x3f) & 1) != 0;
  }
  return false;
}

Assistant:

bool KeyFormatData::IsFindFormatType(Bip32FormatType format_type) const {
  switch (format_type) {
    case kNormal:
    case kBip49:
    case kBip84:
      return (has_format_[format_type]);
    default:
      return false;
  }
}